

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O1

int __thiscall RecordPaddingField::StaticSize(RecordPaddingField *this,Env *env,int offset)

{
  PaddingType PVar1;
  int iVar2;
  bool bVar3;
  ExceptionPaddingError *this_00;
  int iVar4;
  int target_offset;
  int length;
  uint local_40;
  int local_3c;
  string local_38;
  
  PVar1 = this->ptype_;
  iVar4 = -1;
  if (PVar1 == PAD_TO_NEXT_WORD) {
    if (((offset != -1) && (iVar2 = this->wordsize_, iVar2 != -1)) &&
       (iVar4 = iVar2 - offset % iVar2, offset % iVar2 == 0)) {
      iVar4 = 0;
    }
  }
  else if (PVar1 == PAD_TO_OFFSET) {
    if (((offset != -1) && (bVar3 = Expr::ConstFold(this->expr_,env,(int *)&local_40), bVar3)) &&
       (iVar4 = local_40 - offset, (int)local_40 < offset)) {
      this_00 = (ExceptionPaddingError *)__cxa_allocate_exception(0x20);
      strfmt_abi_cxx11_(&local_38,"current offset = %d, target offset = %d",(ulong)(uint)offset,
                        (ulong)local_40);
      ExceptionPaddingError::ExceptionPaddingError
                (this_00,&(this->super_RecordField).super_Field.super_Object,&local_38);
      __cxa_throw(this_00,&ExceptionPaddingError::typeinfo,Exception::~Exception);
    }
  }
  else if (PVar1 == PAD_BY_LENGTH) {
    bVar3 = Expr::ConstFold(this->expr_,env,&local_3c);
    iVar4 = -1;
    if (bVar3) {
      iVar4 = local_3c;
    }
  }
  return iVar4;
}

Assistant:

int RecordPaddingField::StaticSize(Env* env, int offset) const
	{
	int length;
	int target_offset;
	int offset_in_word;

	switch ( ptype_ )
		{
		case PAD_BY_LENGTH:
			return expr_->ConstFold(env, &length) ? length : -1;

		case PAD_TO_OFFSET:
			// If the current offset cannot be statically
			// determined, we need to Generate code to
			// check the offset
			if ( offset == -1 )
				return -1;

			if ( ! expr_->ConstFold(env, &target_offset) )
				return -1;

			// If both the current and target offsets
			// can be statically computed, we can get its
			// static size
			if ( offset > target_offset )
				throw ExceptionPaddingError(this, strfmt("current offset = %d, "
				                                         "target offset = %d",
				                                         offset, target_offset));
			return target_offset - offset;

		case PAD_TO_NEXT_WORD:
			if ( offset == -1 || wordsize_ == -1 )
				return -1;

			offset_in_word = offset % wordsize_;
			return (offset_in_word == 0) ? 0 : wordsize_ - offset_in_word;
		}

	return -1;
	}